

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O2

void idx2::PrintStatistics(brick_pool *Bp)

{
  idx2_file *piVar1;
  long lVar2;
  i64 iVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  uint *local_c8;
  brick_pool *local_b8;
  long local_b0;
  i64 Count [16];
  
  piVar1 = Bp->Idx2;
  Count[0xc] = 0;
  Count[0xd] = 0;
  Count[0xe] = 0;
  Count[0xf] = 0;
  Count[8] = 0;
  Count[9] = 0;
  Count[10] = 0;
  Count[0xb] = 0;
  Count[4] = 0;
  Count[5] = 0;
  Count[6] = 0;
  Count[7] = 0;
  Count[0] = 0;
  Count[1] = 0;
  Count[2] = 0;
  Count[3] = 0;
  Begin<unsigned_long,idx2::brick_volume>(&Bp->BrickTable);
  iVar3 = (Bp->BrickTable).LogCapacity;
  while ((local_b8 != Bp || (local_b0 != 1L << ((byte)iVar3 & 0x3f)))) {
    Count[*local_c8 & 0xf] = Count[*local_c8 & 0xf] + 1;
    lVar4 = local_b0 * 8;
    do {
      lVar4 = lVar4 + 8;
      lVar2 = local_b0 + 1;
      local_b0 = local_b0 + 1;
    } while ((local_b8->BrickTable).Stats[lVar2] != Occupied);
    local_c8 = (uint *)(lVar4 + (long)(local_b8->BrickTable).Keys);
  }
  piVar6 = &(piVar1->NBricks3).Arr[0].field_0.field_0.Z;
  uVar5 = 0;
  while( true ) {
    if (uVar5 == (byte)piVar1->NLevels) {
      return;
    }
    if (uVar5 == 0x10) break;
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n",
           ((double)Count[uVar5] * 100.0) /
           (double)((long)*piVar6 *
                   (long)piVar6[-1] *
                   (long)((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)
                         (piVar6 + -2))->X),uVar5 & 0xffffffff);
    uVar5 = uVar5 + 1;
    piVar6 = piVar6 + 3;
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
               );
}

Assistant:

void
PrintStatistics(const brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  i64 Count[idx2_file::MaxLevels] = {};

  idx2_ForEach (BIt, Bp->BrickTable)
  {
    i8 Level = GetLevelFromBrickKey(*BIt.Key);
    ++Count[Level];
  }
  idx2_For (i8, L, 0, Idx2->NLevels)
  {
    i64 NBricks = Prod<i64>(Idx2->NBricks3[L]);
    f64 Percent = f64(Count[L]) * 100 / f64(NBricks);
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n", L, Count[L], NBricks, Percent);
  }
}